

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.h
# Opt level: O3

void __thiscall
spvtools::opt::InvocationInterlockPlacementPass::~InvocationInterlockPlacementPass
          (InvocationInterlockPlacementPass *this)

{
  MessageConsumer *pMVar1;
  _Manager_type p_Var2;
  
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__InvocationInterlockPlacementPass_003def98;
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->successors_before_end_)._M_h);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->predecessors_after_begin_)._M_h);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->before_end_)._M_h);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->after_begin_)._M_h);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->end_)._M_h);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->begin_)._M_h);
  std::
  _Hashtable<spvtools::opt::Function_*,_std::pair<spvtools::opt::Function_*const,_spvtools::opt::InvocationInterlockPlacementPass::ExtractionResult>,_std::allocator<std::pair<spvtools::opt::Function_*const,_spvtools::opt::InvocationInterlockPlacementPass::ExtractionResult>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Function_*>,_std::hash<spvtools::opt::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->extracted_functions_)._M_h);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__Pass_003d7d90;
  p_Var2 = (this->super_Pass).consumer_.super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    pMVar1 = &(this->super_Pass).consumer_;
    (*p_Var2)((_Any_data *)pMVar1,(_Any_data *)pMVar1,__destroy_functor);
  }
  operator_delete(this,0x1c0);
  return;
}

Assistant:

InvocationInterlockPlacementPass() {}